

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

void __thiscall cmDebugger_impl::SetState(cmDebugger_impl *this,t newState)

{
  t tVar1;
  reference ppcVar2;
  bool bVar3;
  cmDebuggerListener **l;
  iterator __end1;
  iterator __begin1;
  set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
  *__range1;
  bool notifyListeners;
  t newState_local;
  cmDebugger_impl *this_local;
  
  tVar1 = std::atomic::operator_cast_to_t((atomic *)&this->state);
  bVar3 = false;
  if (tVar1 != Unknown) {
    tVar1 = std::atomic::operator_cast_to_t((atomic *)&this->state);
    bVar3 = tVar1 != newState;
  }
  std::atomic<cmDebugger::State::t>::operator=(&this->state,newState);
  if (bVar3) {
    __end1 = std::
             set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
             ::begin(&this->listeners);
    l = (cmDebuggerListener **)
        std::
        set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
        ::end(&this->listeners);
    while (bVar3 = std::operator!=(&__end1,(_Self *)&l), bVar3) {
      ppcVar2 = std::_Rb_tree_const_iterator<cmDebuggerListener_*>::operator*(&__end1);
      (*(*ppcVar2)->_vptr_cmDebuggerListener[2])();
      std::_Rb_tree_const_iterator<cmDebuggerListener_*>::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void SetState(State::t newState)
  {
    bool notifyListeners = state != State::Unknown && state != newState;
    state = newState;
    if (!notifyListeners) {
      return;
    }

    for (auto& l : listeners) {
      l->OnChangeState();
    }
  }